

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_lzop.c
# Opt level: O1

int archive_read_support_filter_lzop(archive *_a)

{
  int iVar1;
  int iVar2;
  
  iVar1 = __archive_read_register_bidder
                    ((archive_read *)_a,(void *)0x0,(char *)0x0,&lzop_bidder_vtable);
  iVar2 = -0x1e;
  if (iVar1 == 0) {
    archive_set_error(_a,-1,"Using external lzop program for lzop decompression");
    iVar2 = -0x14;
  }
  return iVar2;
}

Assistant:

int
archive_read_support_filter_lzop(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;

	if (__archive_read_register_bidder(a, NULL, NULL,
				&lzop_bidder_vtable) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/* Signal the extent of lzop support with the return value here. */
#if defined(HAVE_LZO_LZOCONF_H) && defined(HAVE_LZO_LZO1X_H)
	return (ARCHIVE_OK);
#else
	/* Return ARCHIVE_WARN since this always uses an external program. */
	archive_set_error(_a, ARCHIVE_ERRNO_MISC,
	    "Using external lzop program for lzop decompression");
	return (ARCHIVE_WARN);
#endif
}